

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

void __thiscall crnlib::dxt_image::flip_col(dxt_image *this,uint x)

{
  uint block_x;
  uint uVar1;
  element_type eVar2;
  element *peVar3;
  uint local_3c;
  undefined8 uStack_38;
  uint i;
  element tmp [2];
  uint local_20;
  uint local_1c;
  uint e;
  uint y;
  uint other_x;
  uint x_local;
  dxt_image *this_local;
  
  block_x = (this->m_blocks_x - 1) - x;
  for (local_1c = 0; local_1c < this->m_blocks_y; local_1c = local_1c + 1) {
    for (local_20 = 0; uVar1 = get_elements_per_block(this), local_20 < uVar1;
        local_20 = local_20 + 1) {
      peVar3 = get_element(this,x,local_1c,local_20);
      uStack_38 = *(undefined8 *)peVar3->m_bytes;
      peVar3 = get_element(this,block_x,local_1c,local_20);
      tmp[0].m_bytes = *&peVar3->m_bytes;
      for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
        eVar2 = get_element_type(this,local_20);
        if (eVar2 == cColorDXT1) {
          dxt1_block::flip_x((dxt1_block *)((long)&stack0xffffffffffffffc8 + (ulong)local_3c * 8),4,
                             4);
        }
        else if (eVar2 == cAlphaDXT3) {
          dxt3_block::flip_x((dxt3_block *)((long)&stack0xffffffffffffffc8 + (ulong)local_3c * 8),4,
                             4);
        }
        else if (eVar2 == cAlphaDXT5) {
          dxt5_block::flip_x((dxt5_block *)((long)&stack0xffffffffffffffc8 + (ulong)local_3c * 8),4,
                             4);
        }
      }
      peVar3 = get_element(this,x,local_1c,local_20);
      *&peVar3->m_bytes = tmp[0].m_bytes;
      peVar3 = get_element(this,block_x,local_1c,local_20);
      *(undefined8 *)peVar3->m_bytes = uStack_38;
    }
  }
  return;
}

Assistant:

void dxt_image::flip_col(uint x)
    {
        const uint other_x = (m_blocks_x - 1) - x;
        for (uint y = 0; y < m_blocks_y; y++)
        {
            for (uint e = 0; e < get_elements_per_block(); e++)
            {
                element tmp[2] = { get_element(x, y, e), get_element(other_x, y, e) };

                for (uint i = 0; i < 2; i++)
                {
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp[i])->flip_x();
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp[i])->flip_x();
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp[i])->flip_x();
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                }

                get_element(x, y, e) = tmp[1];
                get_element(other_x, y, e) = tmp[0];
            }
        }
    }